

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  char *in_R8;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *in_R9;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *pDVar1;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *pDVar2;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  TestObject *local_80;
  TestObject *local_78;
  Array<kj::(anonymous_namespace)::TestObject> arr1;
  Array<kj::(anonymous_namespace)::TestObject> arr2;
  Arena arena;
  
  pDVar1 = (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
            *)&_kjCondition;
  pDVar2 = (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
            *)&_kjCondition;
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena(&arena,0x400);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>(&arr1,&arena,4);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>(&arr2,&arena,2);
  _kjCondition.result = arr1.size_ == 4;
  _kjCondition.left = 4;
  _kjCondition.right = arr1.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_78 = (TestObject *)CONCAT44(local_78._4_4_,4);
    local_80 = (TestObject *)arr1.size_;
    in_R8 = "failed: expected (4u) == (arr1.size())";
    kj::_::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x8e,ERROR,
               "\"failed: expected \" \"(4u) == (arr1.size())\", _kjCondition, 4u, arr1.size()",
               (char (*) [39])"failed: expected (4u) == (arr1.size())",&_kjCondition,
               (uint *)&local_78,(unsigned_long *)&local_80);
    in_R9 = pDVar1;
  }
  _kjCondition.result = arr2.size_ == 2;
  _kjCondition.left = 2;
  _kjCondition.right = arr2.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_78 = (TestObject *)CONCAT44(local_78._4_4_,2);
    local_80 = (TestObject *)arr2.size_;
    in_R8 = "failed: expected (2u) == (arr2.size())";
    kj::_::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(2u) == (arr2.size())\", _kjCondition, 2u, arr2.size()",
               (char (*) [39])"failed: expected (2u) == (arr2.size())",&_kjCondition,
               (uint *)&local_78,(unsigned_long *)&local_80);
    in_R9 = pDVar2;
  }
  _kjCondition._0_8_ = arr1.size_ * 4 + CONCAT44(arr1.ptr._4_4_,arr1.ptr._0_4_);
  _kjCondition.right = (unsigned_long)arr2.ptr;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (ulong)_kjCondition._0_8_ <= arr2.ptr;
  if (kj::_::Debug::minSeverity < 3 && arr2.ptr < (ulong)_kjCondition._0_8_) {
    local_78 = arr2.ptr;
    local_80 = (TestObject *)_kjCondition._0_8_;
    kj::_::Debug::
    log<char_const(&)[48],kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&,kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
              ((char *)0x90,(int)&_kjCondition,(LogSeverity)&local_80,(char *)&local_78,
               (char (*) [48])in_R8,in_R9,(TestObject **)_kjCondition._0_8_,(TestObject **)arr2.ptr)
    ;
  }
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 6;
  _kjCondition.left = 6;
  _kjCondition.right = (unsigned_long)&(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_80 = (TestObject *)CONCAT44(local_80._4_4_,6);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(6) == (TestObject::count)\", _kjCondition, 6, TestObject::count"
               ,(char (*) [44])"failed: expected (6) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&local_80,
               &(anonymous_namespace)::TestObject::count);
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&arr2);
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&arr1);
  _kjCondition._0_8_ = (ulong)(uint)_kjCondition._4_4_ << 0x20;
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition.right = (unsigned_long)&(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    arr1.ptr._0_4_ = 0;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&arr1,
               &(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, OwnArray) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Array<TestObject> arr1 = arena.allocateOwnArray<TestObject>(4);
    Array<TestObject> arr2 = arena.allocateOwnArray<TestObject>(2);
    EXPECT_EQ(4u, arr1.size());
    EXPECT_EQ(2u, arr2.size());
    EXPECT_LE(arr1.end(), arr2.begin());
    EXPECT_EQ(6, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}